

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_need_more_events(yaml_emitter_t *emitter)

{
  yaml_event_type_t yVar1;
  yaml_event_t *local_28;
  yaml_event_t *event;
  int accumulate;
  int level;
  yaml_emitter_t *emitter_local;
  
  event._4_4_ = 0;
  if ((emitter->events).head == (emitter->events).tail) {
    emitter_local._4_4_ = 1;
  }
  else {
    yVar1 = ((emitter->events).head)->type;
    if (yVar1 == YAML_DOCUMENT_START_EVENT) {
      event._0_4_ = 1;
    }
    else if (yVar1 == YAML_SEQUENCE_START_EVENT) {
      event._0_4_ = 2;
    }
    else {
      if (yVar1 != YAML_MAPPING_START_EVENT) {
        return 0;
      }
      event._0_4_ = 3;
    }
    if ((long)(int)event < ((long)(emitter->events).tail - (long)(emitter->events).head) / 0x68) {
      emitter_local._4_4_ = 0;
    }
    else {
      for (local_28 = (emitter->events).head; local_28 != (emitter->events).tail;
          local_28 = local_28 + 1) {
        yVar1 = local_28->type;
        if (yVar1 == YAML_STREAM_START_EVENT) {
LAB_0010793e:
          event._4_4_ = event._4_4_ + 1;
        }
        else if (yVar1 == YAML_STREAM_END_EVENT) {
LAB_00107949:
          event._4_4_ = event._4_4_ + -1;
        }
        else {
          if (yVar1 == YAML_DOCUMENT_START_EVENT) goto LAB_0010793e;
          if (yVar1 == YAML_DOCUMENT_END_EVENT) goto LAB_00107949;
          if (yVar1 == YAML_SEQUENCE_START_EVENT) goto LAB_0010793e;
          if (yVar1 == YAML_SEQUENCE_END_EVENT) goto LAB_00107949;
          if (yVar1 == YAML_MAPPING_START_EVENT) goto LAB_0010793e;
          if (yVar1 == YAML_MAPPING_END_EVENT) goto LAB_00107949;
        }
        if (event._4_4_ == 0) {
          return 0;
        }
      }
      emitter_local._4_4_ = 1;
    }
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_need_more_events(yaml_emitter_t *emitter)
{
    int level = 0;
    int accumulate = 0;
    yaml_event_t *event;

    if (QUEUE_EMPTY(emitter, emitter->events))
        return 1;

    switch (emitter->events.head->type) {
        case YAML_DOCUMENT_START_EVENT:
            accumulate = 1;
            break;
        case YAML_SEQUENCE_START_EVENT:
            accumulate = 2;
            break;
        case YAML_MAPPING_START_EVENT:
            accumulate = 3;
            break;
        default:
            return 0;
    }

    if (emitter->events.tail - emitter->events.head > accumulate)
        return 0;

    for (event = emitter->events.head; event != emitter->events.tail; event ++) {
        switch (event->type) {
            case YAML_STREAM_START_EVENT:
            case YAML_DOCUMENT_START_EVENT:
            case YAML_SEQUENCE_START_EVENT:
            case YAML_MAPPING_START_EVENT:
                level += 1;
                break;
            case YAML_STREAM_END_EVENT:
            case YAML_DOCUMENT_END_EVENT:
            case YAML_SEQUENCE_END_EVENT:
            case YAML_MAPPING_END_EVENT:
                level -= 1;
                break;
            default:
                break;
        }
        if (!level)
            return 0;
    }

    return 1;
}